

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void free_constants_list(MOJOSHADER_free f,void *d,ConstantsList *item)

{
  ConstantsList *pCVar1;
  ConstantsList *next;
  ConstantsList *item_local;
  void *d_local;
  MOJOSHADER_free f_local;
  
  next = item;
  while (next != (ConstantsList *)0x0) {
    pCVar1 = next->next;
    (*f)(next,d);
    next = pCVar1;
  }
  return;
}

Assistant:

static void free_constants_list(MOJOSHADER_free f, void *d, ConstantsList *item)
{
    while (item != NULL)
    {
        ConstantsList *next = item->next;
        f(item, d);
        item = next;
    } // while
}